

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

void P_RemoveThing(AActor *actor)

{
  bool bVar1;
  AActor *pAVar2;
  
  if ((actor->player != (player_t *)0x0) && (actor->player->mo == (APlayerPawn *)actor)) {
    return;
  }
  bVar1 = DObject::IsKindOf((DObject *)actor,AInventory::RegistrationInfo.MyClass);
  if ((bVar1) && (pAVar2 = GC::ReadBarrier<AActor>((AActor **)(actor + 1)), pAVar2 != (AActor *)0x0)
     ) {
    return;
  }
  AActor::ClearCounters(actor);
  (*(actor->super_DThinker).super_DObject._vptr_DObject[4])(actor);
  return;
}

Assistant:

void P_RemoveThing(AActor * actor)
{
	// Don't remove live players.
	if (actor->player == NULL || actor != actor->player->mo)
	{
		// Don't also remove owned inventory items
		if (actor->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(actor)->Owner != NULL) return;

		// be friendly to the level statistics. ;)
		actor->ClearCounters();
		actor->Destroy ();
	}

}